

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeGenerator.cpp
# Opt level: O1

FuncInfo * __thiscall ByteCodeGenerator::GetEnclosingFuncInfo(ByteCodeGenerator *this)

{
  RealCount *pRVar1;
  SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *pSVar2;
  Type pFVar3;
  Type pFVar4;
  code *pcVar5;
  bool bVar6;
  Type *ppFVar7;
  undefined4 *puVar8;
  Type pSVar9;
  
  pSVar2 = this->funcInfoStack;
  ppFVar7 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&pSVar2->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar3 = *ppFVar7;
  SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::RemoveHead
            (&pSVar2->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>,
             pSVar2->allocator);
  if ((SList<FuncInfo_*,_Memory::ArenaAllocator,_RealCount> *)
      (this->funcInfoStack->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
      super_SListNodeBase<Memory::ArenaAllocator>.next == this->funcInfoStack) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar8 = 1;
    bVar6 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeGenerator.cpp"
                       ,0x746,"(!this->funcInfoStack->Empty())","!this->funcInfoStack->Empty()");
    if (!bVar6) {
      pcVar5 = (code *)invalidInstructionException();
      (*pcVar5)();
    }
    *puVar8 = 0;
  }
  ppFVar7 = SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>::Head
                      (&this->funcInfoStack->
                        super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>);
  pFVar4 = *ppFVar7;
  pSVar2 = this->funcInfoStack;
  pSVar9 = (Type)new<Memory::ArenaAllocator>(0x10,pSVar2->allocator,0x366bee);
  pSVar9[1].next = (Type)pFVar3;
  pSVar9->next = (pSVar2->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
                 super_SListNodeBase<Memory::ArenaAllocator>.next;
  (pSVar2->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).
  super_SListNodeBase<Memory::ArenaAllocator>.next = pSVar9;
  pRVar1 = &(pSVar2->super_SListBase<FuncInfo_*,_Memory::ArenaAllocator,_RealCount>).super_RealCount
  ;
  pRVar1->count = pRVar1->count + 1;
  return pFVar4;
}

Assistant:

FuncInfo* ByteCodeGenerator::GetEnclosingFuncInfo()
{
    FuncInfo* top = this->funcInfoStack->Pop();

    Assert(!this->funcInfoStack->Empty());

    FuncInfo* second = this->funcInfoStack->Top();

    this->funcInfoStack->Push(top);

    return second;
}